

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall
binlog::PrettyPrinter::printTime
          (PrettyPrinter *this,OstreamBuffer *out,BrokenDownTime *bdt,int tzoffset,char *tzname)

{
  char c;
  pointer pcVar1;
  ulong uVar2;
  OstreamBuffer *this_00;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (this->_timeFormat)._M_string_length;
  if (uVar2 != 0) {
    uVar4 = 0;
    this_00 = (OstreamBuffer *)this;
    do {
      pcVar1 = (this->_timeFormat)._M_dataplus._M_p;
      c = pcVar1[uVar4];
      if ((c == '%') && (uVar3 = uVar4 + 1, uVar4 = uVar2, uVar3 != uVar2)) {
        printTimeField((PrettyPrinter *)this_00,out,pcVar1[uVar3],bdt,tzoffset,tzname);
        uVar4 = uVar3;
      }
      else {
        this_00 = out;
        detail::OstreamBuffer::put(out,c);
      }
      uVar4 = uVar4 + 1;
      uVar2 = (this->_timeFormat)._M_string_length;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

void PrettyPrinter::printTime(detail::OstreamBuffer& out, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  for (std::size_t i = 0; i < _timeFormat.size(); ++i)
  {
    const char c = _timeFormat[i];
    if (c == '%' && ++i != _timeFormat.size())
    {
      const char spec = _timeFormat[i];
      printTimeField(out, spec, bdt, tzoffset, tzname);
    }
    else
    {
      out.put(c);
    }
  }
}